

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

ImVec2 VHRotateV(ImVec2 v,ImVec2 o,double theta)

{
  undefined8 in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  double tty;
  double ttx;
  double ty;
  double tx;
  float local_18;
  float fStack_14;
  float local_10;
  float fStack_c;
  ImVec2 local_8;
  
  local_10 = (float)in_XMM0_Qa;
  local_18 = (float)in_XMM1_Qa;
  fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
  fStack_14 = (float)((ulong)in_XMM1_Qa >> 0x20);
  dVar1 = cos(in_XMM2_Qa);
  dVar2 = sin(in_XMM2_Qa);
  dVar3 = sin(in_XMM2_Qa);
  dVar4 = cos(in_XMM2_Qa);
  ImVec2::ImVec2(&local_8,(float)(((double)(local_10 - local_18) * dVar1 -
                                  (double)(fStack_c - fStack_14) * dVar2) + (double)local_18),
                 (float)((double)(local_10 - local_18) * dVar3 +
                         (double)(fStack_c - fStack_14) * dVar4 + (double)fStack_14));
  return local_8;
}

Assistant:

ImVec2 VHRotateV(ImVec2 v, ImVec2 o, double theta) {
	double tx, ty, ttx, tty;

	tx = v.x - o.x;
	ty = v.y - o.y;

	// With not a lot of parts on the boards, we can get away with using the
	// precision trig functions, might have to change to LUT based later.
	ttx = tx * cos(theta) - ty * sin(theta);
	tty = tx * sin(theta) + ty * cos(theta);

	return ImVec2(ttx + o.x, tty + o.y);
}